

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  Mutex *__mutex;
  size_t *psVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  Mutex *__mutex_00;
  void *ptr;
  _List_node_base *local_58;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  __mutex_00 = &this->budgets_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
  p_Var5 = (_List_node_base *)&this->budgets;
  __mutex = &this->payouts_lock;
  p_Var6 = p_Var5;
  local_38 = p_Var5;
  do {
    p_Var6 = (((_List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var6 == p_Var5) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
      local_40 = (_List_node_base *)0x0;
      iVar4 = posix_memalign(&local_40,0x10,size);
      if (iVar4 != 0) {
        local_40 = (_List_node_base *)0x0;
      }
      p_Var5 = local_40;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      p_Var6 = (_List_node_base *)operator_new(0x20);
      p_Var6[1]._M_next = (_List_node_base *)size;
      p_Var6[1]._M_prev = p_Var5;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(this->payouts).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return p_Var5;
    }
    p_Var2 = p_Var6[1]._M_next;
    bVar3 = true;
    if ((size <= p_Var2) && ((ulong)this->size_compare_ratio * (long)p_Var2 >> 8 <= size)) {
      local_58 = p_Var6[1]._M_prev;
      psVar1 = &(this->budgets).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var6,0x20);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      p_Var5 = (_List_node_base *)operator_new(0x20);
      p_Var5[1]._M_next = p_Var2;
      p_Var5[1]._M_prev = local_58;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->payouts).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      bVar3 = false;
      p_Var5 = local_38;
    }
  } while (bVar3);
  return local_58;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    budgets_lock.lock();

    // find free budget
    std::list< std::pair<size_t, void*> >::iterator it = budgets.begin();
    for (; it != budgets.end(); it++)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            budgets.erase(it);

            budgets_lock.unlock();

            payouts_lock.lock();

            payouts.push_back(std::make_pair(bs, ptr));

            payouts_lock.unlock();

            return ptr;
        }
    }

    budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    payouts_lock.lock();

    payouts.push_back(std::make_pair(size, ptr));

    payouts_lock.unlock();

    return ptr;
}